

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O3

bool cvui::internal::button
               (cvui_block_t *theBlock,int theX,int theY,Mat *theIdle,Mat *theOver,Mat *theDown,
               bool theUpdateLayout)

{
  int iVar1;
  Rect local_48;
  Size local_38;
  
  local_48.height = *(int *)(theIdle + 8);
  local_48.width = *(int *)(theIdle + 0xc);
  local_48.x = theX;
  local_48.y = theY;
  iVar1 = iarea(theX,theY,local_48.width,local_48.height);
  if (((iVar1 == 2) || (theDown = theIdle, iVar1 == 5)) || (theDown = theOver, iVar1 == 4)) {
    render::image(theBlock,&local_48,theDown);
  }
  if (theUpdateLayout) {
    local_38.height = local_48.height;
    local_38.width = local_48.width;
    updateLayoutFlow(theBlock,&local_38);
  }
  return iVar1 == 3;
}

Assistant:

bool button(cvui_block_t& theBlock, int theX, int theY, cv::Mat& theIdle, cv::Mat& theOver, cv::Mat& theDown, bool theUpdateLayout) {
		cv::Rect aRect(theX, theY, theIdle.cols, theIdle.rows);
		int aStatus = cvui::iarea(theX, theY, aRect.width, aRect.height);

		switch (aStatus) {
			case cvui::OUT: render::image(theBlock, aRect, theIdle); break;
			case cvui::OVER: render::image(theBlock, aRect, theOver); break;
			case cvui::DOWN: render::image(theBlock, aRect, theDown); break;
		}

		// Update the layout flow according to button size
		// if we were told to update.
		if (theUpdateLayout) {
			cv::Size aSize(aRect.width, aRect.height);
			updateLayoutFlow(theBlock, aSize);
		}

		// Return true if the button was clicked
		return aStatus == cvui::CLICK;
	}